

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# undo_buffer_allocator.cpp
# Opt level: O3

UndoBufferReference * __thiscall
duckdb::UndoBufferPointer::Pin(UndoBufferReference *__return_storage_ptr__,UndoBufferPointer *this)

{
  UndoBufferEntry *pUVar1;
  idx_t iVar2;
  InternalException *this_00;
  BufferHandle handle;
  undefined1 local_68 [32];
  BufferHandle local_48;
  
  pUVar1 = this->entry;
  if (pUVar1 != (UndoBufferEntry *)0x0) {
    (*pUVar1->buffer_manager->_vptr_BufferManager[7])
              (local_68,pUVar1->buffer_manager,&pUVar1->block);
    pUVar1 = this->entry;
    BufferHandle::BufferHandle(&local_48,(BufferHandle *)local_68);
    iVar2 = this->position;
    (__return_storage_ptr__->entry).ptr = pUVar1;
    BufferHandle::BufferHandle(&__return_storage_ptr__->handle,&local_48);
    __return_storage_ptr__->position = iVar2;
    BufferHandle::~BufferHandle(&local_48);
    BufferHandle::~BufferHandle((BufferHandle *)local_68);
    return __return_storage_ptr__;
  }
  this_00 = (InternalException *)__cxa_allocate_exception(0x10);
  local_68._0_8_ = local_68 + 0x10;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"UndoBufferPointer::Pin called but no entry was found","");
  InternalException::InternalException(this_00,(string *)local_68);
  __cxa_throw(this_00,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

UndoBufferReference UndoBufferPointer::Pin() const {
	if (!entry) {
		throw InternalException("UndoBufferPointer::Pin called but no entry was found");
	}
	D_ASSERT(entry->capacity >= position);
	auto handle = entry->buffer_manager.Pin(entry->block);
	return UndoBufferReference(*entry, std::move(handle), position);
}